

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactorUtils.cpp
# Opt level: O1

void __thiscall HFactor::reportLu(HFactor *this,HighsInt l_u_or_both,bool full)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  long lVar4;
  HFactor *pHVar5;
  ulong uVar6;
  HighsInt iEl;
  long lVar7;
  string local_538;
  string local_518;
  string local_4f8;
  string local_4d8;
  string local_4b8;
  string local_498;
  string local_478;
  string local_458;
  string local_438;
  string local_418;
  string local_3f8;
  string local_3d8;
  string local_3b8;
  string local_398;
  string local_378;
  string local_358;
  string local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  undefined1 local_258 [48];
  undefined1 local_228 [48];
  undefined1 local_1f8 [48];
  undefined1 local_1c8 [48];
  undefined1 local_198 [48];
  undefined1 local_168 [48];
  undefined1 local_138 [48];
  undefined1 local_108 [48];
  undefined1 local_d8 [48];
  undefined1 local_a8 [48];
  undefined1 local_78 [48];
  _func_void_HighsLogType_char_ptr_void_ptr *local_48;
  
  if (0xfffffffc < l_u_or_both - 4U) {
    if ((l_u_or_both & 1U) != 0) {
      putchar(0x4c);
      if (full) {
        printf(" - full");
        puts(":");
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"l_pivot_lookup","");
        pHVar5 = (HFactor *)&stack0xffffffffffffffb8;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)pHVar5,&this->l_pivot_lookup);
        reportIntVector(pHVar5,&local_278,
                        (vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffb8);
        if (local_48 != (_func_void_HighsLogType_char_ptr_void_ptr *)0x0) {
          operator_delete(local_48);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p);
        }
      }
      else {
        puts(":");
      }
      if (full) {
        local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"l_pivot_index","");
        pHVar5 = (HFactor *)(local_78 + 0x18);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)pHVar5,&this->l_pivot_index);
        reportIntVector(pHVar5,&local_298,(vector<int,_std::allocator<int>_> *)(local_78 + 0x18));
        if ((bool *)local_78._24_8_ != (bool *)0x0) {
          operator_delete((void *)local_78._24_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          operator_delete(local_298._M_dataplus._M_p);
        }
      }
      local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"l_start","");
      pHVar5 = (HFactor *)local_78;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)pHVar5,&this->l_start);
      reportIntVector(pHVar5,&local_2b8,(vector<int,_std::allocator<int>_> *)local_78);
      if ((_func_void_HighsLogType_char_ptr_void_ptr *)local_78._0_8_ !=
          (_func_void_HighsLogType_char_ptr_void_ptr *)0x0) {
        operator_delete((void *)local_78._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p);
      }
      local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"l_index","");
      pHVar5 = (HFactor *)(local_a8 + 0x18);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)pHVar5,&this->l_index);
      reportIntVector(pHVar5,&local_2d8,(vector<int,_std::allocator<int>_> *)(local_a8 + 0x18));
      if ((bool *)local_a8._24_8_ != (bool *)0x0) {
        operator_delete((void *)local_a8._24_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p);
      }
      local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"l_value","");
      pHVar5 = (HFactor *)local_a8;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)pHVar5,&this->l_value);
      reportDoubleVector(pHVar5,&local_2f8,(vector<double,_std::allocator<double>_> *)local_a8);
      if ((pointer)local_a8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_a8._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
        operator_delete(local_2f8._M_dataplus._M_p);
      }
      if (full) {
        local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"lr_start","");
        pHVar5 = (HFactor *)(local_d8 + 0x18);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)pHVar5,&this->lr_start);
        reportIntVector(pHVar5,&local_318,(vector<int,_std::allocator<int>_> *)(local_d8 + 0x18));
        if ((bool *)local_d8._24_8_ != (bool *)0x0) {
          operator_delete((void *)local_d8._24_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318._M_dataplus._M_p != &local_318.field_2) {
          operator_delete(local_318._M_dataplus._M_p);
        }
        local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"lr_index","");
        pHVar5 = (HFactor *)local_d8;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)pHVar5,&this->lr_index);
        reportIntVector(pHVar5,&local_338,(vector<int,_std::allocator<int>_> *)local_d8);
        if ((_func_void_HighsLogType_char_ptr_void_ptr *)local_d8._0_8_ !=
            (_func_void_HighsLogType_char_ptr_void_ptr *)0x0) {
          operator_delete((void *)local_d8._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_338._M_dataplus._M_p != &local_338.field_2) {
          operator_delete(local_338._M_dataplus._M_p);
        }
        local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"lr_value","");
        pHVar5 = (HFactor *)(local_108 + 0x18);
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)pHVar5,&this->lr_value);
        reportDoubleVector(pHVar5,&local_358,
                           (vector<double,_std::allocator<double>_> *)(local_108 + 0x18));
        if ((bool *)local_108._24_8_ != (bool *)0x0) {
          operator_delete((void *)local_108._24_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_358._M_dataplus._M_p != &local_358.field_2) {
          operator_delete(local_358._M_dataplus._M_p);
        }
      }
    }
    if (1 < (uint)l_u_or_both) {
      putchar(0x55);
      if (full) {
        printf(" - full");
        puts(":");
        local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"u_pivot_lookup","");
        pHVar5 = (HFactor *)local_108;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)pHVar5,&this->u_pivot_lookup);
        reportIntVector(pHVar5,&local_378,(vector<int,_std::allocator<int>_> *)local_108);
        if ((_func_void_HighsLogType_char_ptr_void_ptr *)local_108._0_8_ !=
            (_func_void_HighsLogType_char_ptr_void_ptr *)0x0) {
          operator_delete((void *)local_108._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_378._M_dataplus._M_p != &local_378.field_2) {
          operator_delete(local_378._M_dataplus._M_p);
        }
      }
      else {
        puts(":");
      }
      local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,"u_pivot_index","");
      pHVar5 = (HFactor *)(local_138 + 0x18);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)pHVar5,&this->u_pivot_index);
      reportIntVector(pHVar5,&local_398,(vector<int,_std::allocator<int>_> *)(local_138 + 0x18));
      if ((bool *)local_138._24_8_ != (bool *)0x0) {
        operator_delete((void *)local_138._24_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_398._M_dataplus._M_p != &local_398.field_2) {
        operator_delete(local_398._M_dataplus._M_p);
      }
      local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"u_pivot_value","");
      pHVar5 = (HFactor *)local_138;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)pHVar5,&this->u_pivot_value);
      reportDoubleVector(pHVar5,&local_3b8,(vector<double,_std::allocator<double>_> *)local_138);
      if ((pointer)local_138._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_138._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
        operator_delete(local_3b8._M_dataplus._M_p);
      }
      local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"u_start","");
      pHVar5 = (HFactor *)(local_168 + 0x18);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)pHVar5,&this->u_start);
      reportIntVector(pHVar5,&local_3d8,(vector<int,_std::allocator<int>_> *)(local_168 + 0x18));
      if ((pointer)local_168._24_8_ != (pointer)0x0) {
        operator_delete((void *)local_168._24_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
        operator_delete(local_3d8._M_dataplus._M_p);
      }
      if (full) {
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"u_last_p","");
        pHVar5 = (HFactor *)local_168;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)pHVar5,&this->u_last_p);
        reportIntVector(pHVar5,&local_3f8,(vector<int,_std::allocator<int>_> *)local_168);
        if ((pointer)local_168._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_168._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
          operator_delete(local_3f8._M_dataplus._M_p);
        }
      }
      local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"u_index","");
      pHVar5 = (HFactor *)(local_198 + 0x18);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)pHVar5,&this->u_index);
      reportIntVector(pHVar5,&local_418,(vector<int,_std::allocator<int>_> *)(local_198 + 0x18));
      if ((pointer)local_198._24_8_ != (pointer)0x0) {
        operator_delete((void *)local_198._24_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_418._M_dataplus._M_p != &local_418.field_2) {
        operator_delete(local_418._M_dataplus._M_p);
      }
      local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"u_value","");
      pHVar5 = (HFactor *)local_198;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)pHVar5,&this->u_value);
      reportDoubleVector(pHVar5,&local_438,(vector<double,_std::allocator<double>_> *)local_198);
      if ((pointer)local_198._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_198._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._M_dataplus._M_p != &local_438.field_2) {
        operator_delete(local_438._M_dataplus._M_p);
      }
      if (full) {
        local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_458,"ur_start","");
        pHVar5 = (HFactor *)(local_1c8 + 0x18);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)pHVar5,&this->ur_start);
        reportIntVector(pHVar5,&local_458,(vector<int,_std::allocator<int>_> *)(local_1c8 + 0x18));
        if ((pointer)local_1c8._24_8_ != (pointer)0x0) {
          operator_delete((void *)local_1c8._24_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_458._M_dataplus._M_p != &local_458.field_2) {
          operator_delete(local_458._M_dataplus._M_p);
        }
        local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"ur_lastp","");
        pHVar5 = (HFactor *)local_1c8;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)pHVar5,&this->ur_lastp);
        reportIntVector(pHVar5,&local_478,(vector<int,_std::allocator<int>_> *)local_1c8);
        if ((pointer)local_1c8._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_1c8._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_478._M_dataplus._M_p != &local_478.field_2) {
          operator_delete(local_478._M_dataplus._M_p);
        }
        local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_498,"ur_space","");
        pHVar5 = (HFactor *)(local_1f8 + 0x18);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)pHVar5,&this->ur_space);
        reportIntVector(pHVar5,&local_498,(vector<int,_std::allocator<int>_> *)(local_1f8 + 0x18));
        if ((pointer)local_1f8._24_8_ != (pointer)0x0) {
          operator_delete((void *)local_1f8._24_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_498._M_dataplus._M_p != &local_498.field_2) {
          operator_delete(local_498._M_dataplus._M_p);
        }
        piVar3 = (this->ur_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((this->ur_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish != piVar3) {
          uVar6 = 0;
          do {
            iVar1 = piVar3[uVar6];
            lVar4 = (long)iVar1;
            iVar2 = (this->ur_lastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar6];
            if (iVar1 < iVar2) {
              printf("UR    Row %2d: ",uVar6 & 0xffffffff);
              lVar7 = lVar4;
              do {
                printf("%11d ",(ulong)(uint)(this->ur_index).
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_start[lVar7]);
                lVar7 = lVar7 + 1;
              } while (iVar2 != lVar7);
              printf("\n              ");
              if (iVar1 < iVar2) {
                do {
                  printf("%11.4g ",
                         (this->ur_value).super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start[lVar4]);
                  lVar4 = lVar4 + 1;
                } while (iVar2 != lVar4);
              }
              putchar(10);
            }
            uVar6 = uVar6 + 1;
            piVar3 = (this->ur_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
          } while (uVar6 < (ulong)((long)(this->ur_start).
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_finish - (long)piVar3 >> 2));
        }
      }
    }
    if (full && l_u_or_both == 3) {
      local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b8,"pf_pivot_value","");
      pHVar5 = (HFactor *)local_1f8;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)pHVar5,&this->pf_pivot_value);
      reportDoubleVector(pHVar5,&local_4b8,(vector<double,_std::allocator<double>_> *)local_1f8);
      if ((pointer)local_1f8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_1f8._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
        operator_delete(local_4b8._M_dataplus._M_p);
      }
      local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d8,"pf_pivot_index","");
      pHVar5 = (HFactor *)(local_228 + 0x18);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)pHVar5,&this->pf_pivot_index);
      reportIntVector(pHVar5,&local_4d8,(vector<int,_std::allocator<int>_> *)(local_228 + 0x18));
      if ((pointer)local_228._24_8_ != (pointer)0x0) {
        operator_delete((void *)local_228._24_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
        operator_delete(local_4d8._M_dataplus._M_p);
      }
      local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f8,"pf_start","");
      pHVar5 = (HFactor *)local_228;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)pHVar5,&this->pf_start);
      reportIntVector(pHVar5,&local_4f8,(vector<int,_std::allocator<int>_> *)local_228);
      if ((pointer)local_228._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_228._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
        operator_delete(local_4f8._M_dataplus._M_p);
      }
      local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_518,"pf_index","");
      pHVar5 = (HFactor *)(local_258 + 0x18);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)pHVar5,&this->pf_index);
      reportIntVector(pHVar5,&local_518,(vector<int,_std::allocator<int>_> *)(local_258 + 0x18));
      if ((pointer)local_258._24_8_ != (pointer)0x0) {
        operator_delete((void *)local_258._24_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_518._M_dataplus._M_p != &local_518.field_2) {
        operator_delete(local_518._M_dataplus._M_p);
      }
      local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_538,"pf_value","");
      pHVar5 = (HFactor *)local_258;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)pHVar5,&this->pf_value);
      reportDoubleVector(pHVar5,&local_538,(vector<double,_std::allocator<double>_> *)local_258);
      if ((pointer)local_258._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_258._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_538._M_dataplus._M_p != &local_538.field_2) {
        operator_delete(local_538._M_dataplus._M_p);
      }
    }
  }
  return;
}

Assistant:

void HFactor::reportLu(const HighsInt l_u_or_both, const bool full) const {
  if (l_u_or_both < kReportLuJustL || l_u_or_both > kReportLuBoth) return;
  if (l_u_or_both & 1) {
    printf("L");
    if (full) printf(" - full");
    printf(":\n");

    if (full) reportIntVector("l_pivot_lookup", l_pivot_lookup);
    if (full) reportIntVector("l_pivot_index", l_pivot_index);
    reportIntVector("l_start", l_start);
    reportIntVector("l_index", l_index);
    reportDoubleVector("l_value", l_value);
    if (full) {
      reportIntVector("lr_start", lr_start);
      reportIntVector("lr_index", lr_index);
      reportDoubleVector("lr_value", lr_value);
    }
  }
  if (l_u_or_both & 2) {
    printf("U");
    if (full) printf(" - full");
    printf(":\n");
    if (full) reportIntVector("u_pivot_lookup", u_pivot_lookup);
    reportIntVector("u_pivot_index", u_pivot_index);
    reportDoubleVector("u_pivot_value", u_pivot_value);
    reportIntVector("u_start", u_start);
    if (full) reportIntVector("u_last_p", u_last_p);
    reportIntVector("u_index", u_index);
    reportDoubleVector("u_value", u_value);
    if (full) {
      reportIntVector("ur_start", ur_start);
      reportIntVector("ur_lastp", ur_lastp);
      reportIntVector("ur_space", ur_space);
      for (size_t iRow = 0; iRow < ur_start.size(); iRow++) {
        const HighsInt start = ur_start[iRow];
        const HighsInt end = ur_lastp[iRow];
        if (start >= end) continue;
        printf("UR    Row %2d: ", (int)iRow);
        for (HighsInt iEl = start; iEl < end; iEl++)
          printf("%11d ", (int)ur_index[iEl]);
        printf("\n              ");
        for (HighsInt iEl = start; iEl < end; iEl++)
          printf("%11.4g ", ur_value[iEl]);
        printf("\n");
      }
      //      reportIntVector("ur_index", ur_index);
      //      reportDoubleVector("ur_value", ur_value);
    }
  }
  if (l_u_or_both == 3 && full) {
    reportDoubleVector("pf_pivot_value", pf_pivot_value);
    reportIntVector("pf_pivot_index", pf_pivot_index);
    reportIntVector("pf_start", pf_start);
    reportIntVector("pf_index", pf_index);
    reportDoubleVector("pf_value", pf_value);
  }
}